

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite_correlated_expressions.cpp
# Opt level: O2

void __thiscall
duckdb::RewriteCorrelatedRecursive::RewriteCorrelatedSubquery
          (RewriteCorrelatedRecursive *this,Binder *binder,BoundQueryNode *subquery)

{
  pointer pCVar1;
  long lVar2;
  idx_t iVar3;
  iterator iVar4;
  CorrelatedColumnInfo *corr;
  pointer __k;
  
  pCVar1 = (binder->correlated_columns).
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (binder->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pCVar1; __k = __k + 1) {
    iVar4 = ::std::
            _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->correlated_map->_M_h,&__k->binding);
    if (iVar4.super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>
        ._M_cur != (__node_type *)0x0) {
      lVar2 = *(long *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>
                              ._M_cur + 0x18);
      iVar3 = (this->base_binding).column_index;
      (__k->binding).table_index = (this->base_binding).table_index;
      (__k->binding).column_index = lVar2 + iVar3;
    }
  }
  (*(this->super_BoundNodeVisitor)._vptr_BoundNodeVisitor[2])(this,subquery);
  return;
}

Assistant:

void RewriteCorrelatedRecursive::RewriteCorrelatedSubquery(Binder &binder, BoundQueryNode &subquery) {
	// rewrite the binding in the correlated list of the subquery)
	for (auto &corr : binder.correlated_columns) {
		auto entry = correlated_map.find(corr.binding);
		if (entry != correlated_map.end()) {
			corr.binding = ColumnBinding(base_binding.table_index, base_binding.column_index + entry->second);
		}
	}
	VisitBoundQueryNode(subquery);
}